

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::data__vcount
          (LibraryControllersLoader *this,unsigned_long_long *data,size_t length)

{
  SkinControllerData *pSVar1;
  unsigned_long_long uVar2;
  undefined8 in_RAX;
  size_t sVar3;
  undefined8 uStack_38;
  
  pSVar1 = this->mCurrentSkinControllerData;
  if (pSVar1 != (SkinControllerData *)0x0) {
    uStack_38 = in_RAX;
    COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
              (&pSVar1->mJointsPerVertex,(pSVar1->mJointsPerVertex).mCount + length);
    if (length != 0) {
      sVar3 = 0;
      do {
        uVar2 = data[sVar3];
        uStack_38 = CONCAT44((int)uVar2,(undefined4)uStack_38);
        COLLADAFW::ArrayPrimitiveType<unsigned_int>::append
                  (&pSVar1->mJointsPerVertex,(uint *)((long)&uStack_38 + 4));
        this->mCurrentJointsVertexPairCount = this->mCurrentJointsVertexPairCount + uVar2;
        sVar3 = sVar3 + 1;
      } while (length != sVar3);
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::data__vcount( const unsigned long long* data, size_t length )
	{
		if ( !mCurrentSkinControllerData )
			return true;
		COLLADAFW::UIntValuesArray& jointsPerVertex = mCurrentSkinControllerData->getJointsPerVertex();
		size_t count = jointsPerVertex.getCount();
		jointsPerVertex.reallocMemory( count + length);
		for ( size_t i = 0; i < length; ++i)
		{
			unsigned long long vcount = data[i];
			jointsPerVertex.append((unsigned int)vcount);
			mCurrentJointsVertexPairCount += (size_t)vcount;
		}
		return true;
	}